

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.h
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionRayleighEasyRectangular::~ChBeamSectionRayleighEasyRectangular
          (ChBeamSectionRayleighEasyRectangular *this)

{
  ChBeamSection::~ChBeamSection((ChBeamSection *)this);
  ::operator_delete(this,0x80);
  return;
}

Assistant:

class ChApi ChBeamSectionRayleighEasyRectangular : public ChBeamSectionRayleighSimple {
  public:
      ChBeamSectionRayleighEasyRectangular(double width_y,  ///< width of section in y direction
          double width_z,  ///< width of section in z direction
          double E,        ///< Young modulus
          double G,        ///< Shear modulus (only needed for the torsion)
          double density   ///< volumetric density (ex. in SI units: [kg/m^3])
      );
}